

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O3

ON_OBSOLETE_V2_DimLinear *
ON_OBSOLETE_V2_DimLinear::CreateFromV5LinearDimension
          (ON_OBSOLETE_V5_DimLinear *V5_linear_dimension,ON_3dmAnnotationContext *annotation_context
          ,ON_OBSOLETE_V2_DimLinear *destination)

{
  ON_OBSOLETE_V2_Annotation *this;
  ON_3dmAnnotationContext *extraout_RDX;
  
  this = &destination->super_ON_OBSOLETE_V2_Annotation;
  if (destination == (ON_OBSOLETE_V2_DimLinear *)0x0) {
    this = (ON_OBSOLETE_V2_Annotation *)operator_new(200);
    ON_OBSOLETE_V2_DimLinear((ON_OBSOLETE_V2_DimLinear *)this);
    destination = (ON_OBSOLETE_V2_DimLinear *)extraout_RDX;
  }
  ON_OBSOLETE_V2_Annotation::Internal_InitializeFromV5Annotation
            (this,&V5_linear_dimension->super_ON_OBSOLETE_V5_Annotation,
             (ON_3dmAnnotationContext *)destination);
  return (ON_OBSOLETE_V2_DimLinear *)this;
}

Assistant:

ON_OBSOLETE_V2_DimLinear* ON_OBSOLETE_V2_DimLinear::CreateFromV5LinearDimension(
  const class ON_OBSOLETE_V5_DimLinear& V5_linear_dimension,
  const ON_3dmAnnotationContext* annotation_context,
  ON_OBSOLETE_V2_DimLinear* destination
)
{
  ON_OBSOLETE_V2_DimLinear* V2_linear_dimension
    = (nullptr != destination)
    ? destination
    : new ON_OBSOLETE_V2_DimLinear();
  V2_linear_dimension->Internal_InitializeFromV5Annotation(V5_linear_dimension,annotation_context);
  return V2_linear_dimension;
}